

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_11::CorruptionReporter::~CorruptionReporter(CorruptionReporter *this)

{
  log::Reader::Reporter::~Reporter(&this->super_Reporter);
  operator_delete(this);
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& status) override {
    std::string r = "corruption: ";
    AppendNumberTo(&r, bytes);
    r += " bytes; ";
    r += status.ToString();
    r.push_back('\n');
    dst_->Append(r);
  }